

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::MatchesRegexMatcher::MatchAndExplain<std::__cxx11::string>
          (MatchesRegexMatcher *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  RE *re;
  bool bVar1;
  string s2;
  char *local_30 [4];
  
  std::__cxx11::string::string((string *)local_30,(string *)s);
  re = (this->regex_).super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  if (this->full_match_ == true) {
    bVar1 = RE::FullMatch(local_30[0],re);
  }
  else {
    bVar1 = RE::PartialMatch(local_30[0],re);
  }
  std::__cxx11::string::~string((string *)local_30);
  return bVar1;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    const std::string s2(s);
    return full_match_ ? RE::FullMatch(s2, *regex_)
                       : RE::PartialMatch(s2, *regex_);
  }